

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_fopen(FILE **ppFile,char *pFilePath,char *pOpenMode)

{
  ma_result mVar1;
  FILE *pFVar2;
  int *piVar3;
  
  mVar1 = MA_INVALID_ARGS;
  if ((ppFile != (FILE **)0x0) &&
     (*ppFile = (FILE *)0x0, pOpenMode != (char *)0x0 && pFilePath != (char *)0x0)) {
    pFVar2 = fopen(pFilePath,pOpenMode);
    *ppFile = (FILE *)pFVar2;
    mVar1 = MA_SUCCESS;
    if (pFVar2 == (FILE *)0x0) {
      piVar3 = __errno_location();
      mVar1 = ma_result_from_errno(*piVar3);
      mVar1 = -(uint)(mVar1 == MA_SUCCESS) | mVar1;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_fopen(FILE** ppFile, const char* pFilePath, const char* pOpenMode)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
    errno_t err;
#endif

    if (ppFile != NULL) {
        *ppFile = NULL;  /* Safety. */
    }

    if (pFilePath == NULL || pOpenMode == NULL || ppFile == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(_MSC_VER) && _MSC_VER >= 1400
    err = fopen_s(ppFile, pFilePath, pOpenMode);
    if (err != 0) {
        return ma_result_from_errno(err);
    }
#else
#if defined(_WIN32) || defined(__APPLE__)
    *ppFile = fopen(pFilePath, pOpenMode);
#else
    #if defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64 && defined(_LARGEFILE64_SOURCE)
        *ppFile = fopen64(pFilePath, pOpenMode);
    #else
        *ppFile = fopen(pFilePath, pOpenMode);
    #endif
#endif
    if (*ppFile == NULL) {
        ma_result result = ma_result_from_errno(errno);
        if (result == MA_SUCCESS) {
            result = MA_ERROR;   /* Just a safety check to make sure we never ever return success when pFile == NULL. */
        }

        return result;
    }
#endif

    return MA_SUCCESS;
}